

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O0

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor *cursor,long index)

{
  coda_type *pcVar1;
  long lVar2;
  coda_dynamic_type_struct *pcVar3;
  int *piVar4;
  long num_elements;
  coda_dynamic_type *base_type;
  long index_local;
  coda_cursor *cursor_local;
  
  piVar4 = (int *)__tls_get_addr(&PTR_00246fe0);
  if ((*piVar4 == 0) ||
     ((pcVar1 = (cursor->stack[cursor->n + -1].type)->definition, lVar2._0_4_ = pcVar1[1].type_class
      , lVar2._4_4_ = pcVar1[1].read_type, -1 < index && (index < lVar2)))) {
    pcVar3 = *(coda_dynamic_type_struct **)(cursor->stack[cursor->n + -1].type + 2);
    cursor->n = cursor->n + 1;
    cursor->stack[cursor->n + -1].type = pcVar3;
    cursor->stack[cursor->n + -1].index = index;
    cursor->stack[cursor->n + -1].bit_offset = -1;
    cursor_local._4_4_ = 0;
  }
  else {
    coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",index,lVar2);
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_dynamic_type *base_type;

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        num_elements = ((coda_type_array *)cursor->stack[cursor->n - 1].type->definition)->num_elements;
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    base_type = (coda_dynamic_type *)((coda_cdf_variable *)cursor->stack[cursor->n - 1].type)->base_type;

    cursor->n++;
    cursor->stack[cursor->n - 1].type = base_type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* not applicable for netCDF backend */

    return 0;
}